

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O2

void __thiscall brotli::StartPosQueue::Push(StartPosQueue *this,size_t pos,double costdiff)

{
  double dVar1;
  double dVar2;
  pointer ppVar3;
  unsigned_long uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  pointer ppVar9;
  ulong uVar10;
  pointer ppVar11;
  
  if (costdiff < INFINITY) {
    ppVar3 = (this->q_).
             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = -this->idx_ & this->mask_;
    uVar7 = this->idx_ + 1;
    this->idx_ = uVar7;
    uVar6 = this->mask_ + 1;
    if (uVar7 <= uVar6) {
      uVar6 = uVar7;
    }
    ppVar3[uVar5].first = pos;
    ppVar3[uVar5].second = costdiff;
    for (uVar7 = 1; uVar7 < uVar6; uVar7 = uVar7 + 1) {
      uVar10 = this->mask_ & uVar5;
      dVar1 = ppVar3[uVar10].second;
      uVar5 = uVar5 + 1;
      uVar8 = this->mask_ & uVar5;
      dVar2 = ppVar3[uVar8].second;
      if (dVar2 < dVar1) {
        ppVar11 = ppVar3 + uVar10;
        ppVar9 = ppVar3 + uVar8;
        uVar4 = ppVar11->first;
        ppVar11->first = ppVar9->first;
        ppVar9->first = uVar4;
        ppVar11->second = dVar2;
        ppVar9->second = dVar1;
      }
    }
  }
  return;
}

Assistant:

void Push(size_t pos, double costdiff) {
    if (costdiff == kInfinity) {
      // We can't start a command from an unreachable start position.
      // E.g. position 1 in a stream is always unreachable, because all commands
      // have a copy of at least length 2.
      return;
    }
    size_t offset = -idx_ & mask_;
    ++idx_;
    size_t len = size();
    q_[offset] = std::make_pair(pos, costdiff);
    /* Restore the sorted order. In the list of |len| items at most |len - 1|
       adjacent element comparisons / swaps are required. */
    for (size_t i = 1; i < len; ++i) {
      if (q_[offset & mask_].second > q_[(offset + 1) & mask_].second) {
        std::swap(q_[offset & mask_], q_[(offset + 1) & mask_]);
      }
      ++offset;
    }
  }